

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha1.c
# Opt level: O1

void rhash_sha1_final(sha1_ctx *ctx,uchar *result)

{
  ulong uVar1;
  uint uVar2;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  int iVar3;
  
  uVar2 = (uint)ctx->length;
  ctx->message[uVar2 & 0x3f] = 0x80;
  uVar4 = (uVar2 & 0x3f) + 1;
  if ((uVar4 & 3) != 0) {
    memset(ctx->message + (ulong)(uVar2 & 0x3f) + 1,0,(ulong)(2 - uVar2 & 3) + 1);
    uVar5 = (ulong)(uVar2 & 0x3f) + 2;
    do {
      uVar6 = uVar5 + 1;
      uVar1 = uVar5 & 3;
      uVar5 = uVar6;
    } while (uVar1 != 0);
    uVar4 = (int)uVar6 - 1;
  }
  if (uVar4 < 0x39) {
    uVar4 = uVar4 >> 2;
  }
  else {
    if (uVar4 < 0x40) {
      ctx->message[0x3c] = '\0';
      ctx->message[0x3d] = '\0';
      ctx->message[0x3e] = '\0';
      ctx->message[0x3f] = '\0';
    }
    rhash_sha1_process_block(ctx->hash,(uint *)ctx);
    uVar4 = 0;
  }
  if (uVar4 < 0xe) {
    memset(ctx->message + (ulong)uVar4 * 4,0,(ulong)(0xd - uVar4) * 4 + 4);
  }
  uVar5 = ctx->length;
  uVar2 = (uint)(uVar5 >> 0x1d);
  *(uint *)(ctx->message + 0x38) =
       uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
  iVar3 = (int)uVar5;
  uVar2 = iVar3 << 3;
  *(uint *)(ctx->message + 0x3c) =
       uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | iVar3 << 0x1b;
  rhash_sha1_process_block(ctx->hash,(uint *)ctx);
  if (result != (uchar *)0x0) {
    rhash_swap_copy_str_to_u32(result,0,ctx->hash,0x14);
    return;
  }
  return;
}

Assistant:

void rhash_sha1_final(sha1_ctx *ctx, unsigned char* result)
{
	unsigned  index = (unsigned)ctx->length & 63;
	unsigned* msg32 = (unsigned*)ctx->message;

	/* pad message and run for last block */
	ctx->message[index++] = 0x80;
	while ((index & 3) != 0) {
		ctx->message[index++] = 0;
	}
	index >>= 2;

	/* if no room left in the message to store 64-bit message length */
	if (index > 14) {
		/* then fill the rest with zeros and process it */
		while (index < 16) {
			msg32[index++] = 0;
		}
		rhash_sha1_process_block(ctx->hash, msg32);
		index = 0;
	}
	while (index < 14) {
		msg32[index++] = 0;
	}
	msg32[14] = be2me_32( (unsigned)(ctx->length >> 29) );
	msg32[15] = be2me_32( (unsigned)(ctx->length << 3) );
	rhash_sha1_process_block(ctx->hash, msg32);

	if (result) be32_copy(result, 0, &ctx->hash, sha1_hash_size);
}